

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

QDateTime __thiscall QDateTime::addMonths(QDateTime *this,int nmonths)

{
  QDateTimePrivate *pQVar1;
  QDate date;
  int in_EDX;
  undefined4 in_register_00000034;
  QDateTimeData *d;
  long in_FS_OFFSET;
  pair<QDate,_QTime> pVar2;
  QDate local_38;
  undefined1 *puStack_30;
  long local_28;
  
  d = (QDateTimeData *)CONCAT44(in_register_00000034,nmonths);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d->d;
  if (((ulong)pQVar1 & 1) == 0) {
    pQVar1 = (QDateTimePrivate *)
             (ulong)(pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  if (((ulong)pQVar1 & 0xe) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QDateTime(this);
      return (QDateTime)(Data)this;
    }
  }
  else {
    (this->d).d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QDateTime(this,(QDateTime *)&d->data);
    local_38.jd = (qint64)&DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    pVar2 = getDateTime(d);
    local_38 = pVar2.first.jd;
    puStack_30 = (undefined1 *)CONCAT44(puStack_30._4_4_,pVar2.second.mds.mds);
    date = QDate::addMonths(&local_38,in_EDX);
    massageAdjustedDateTime
              (&this->d,date,pVar2.second.mds,(bool)((byte)~(byte)((uint)in_EDX >> 0x18) >> 7));
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return (QDateTime)(Data)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QDateTime::addMonths(int nmonths) const
{
    if (isNull())
        return QDateTime();

    QDateTime dt(*this);
    std::pair<QDate, QTime> p = getDateTime(d);
    massageAdjustedDateTime(dt.d, p.first.addMonths(nmonths), p.second, nmonths >= 0);
    return dt;
}